

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O2

void __thiscall wasm::Analyzer::scanChildren(Analyzer *this,Expression *curr)

{
  undefined8 uVar1;
  bool bVar2;
  Index IVar3;
  StructNew *pSVar4;
  Expression **ppEVar5;
  size_type sVar6;
  mapped_type *this_00;
  ulong index;
  undefined1 auVar7 [8];
  Iterator IVar8;
  undefined1 local_1d0 [352];
  uintptr_t local_70;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *local_68;
  _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_60;
  Module *local_58;
  _Map_base<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<const_std::pair<wasm::HeapType,_unsigned_int>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_std::pair<wasm::HeapType,_unsigned_int>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_50;
  undefined1 local_48 [8];
  StructField structField;
  Expression *operand;
  
  if (((this->options->closedWorld == true) && ((curr->type).id != 1)) && (curr->_id == StructNewId)
     ) {
    pSVar4 = Expression::cast<wasm::StructNew>(curr);
    local_70 = (uintptr_t)
               wasm::Type::getHeapType
                         (&(pSVar4->super_SpecificExpression<(wasm::Expression::Id)65>).
                           super_Expression.type);
    local_68 = &(pSVar4->operands).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
    local_60 = &(this->readStructFields)._M_h;
    local_50 = (_Map_base<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<const_std::pair<wasm::HeapType,_unsigned_int>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_std::pair<wasm::HeapType,_unsigned_int>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)&this->unreadStructFieldExprMap;
    for (index = 0;
        index < (pSVar4->operands).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                usedElements; index = (ulong)((int)index + 1)) {
      ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (local_68,index);
      structField._8_8_ = *ppEVar5;
      local_48 = (undefined1  [8])local_70;
      structField.first.id._0_4_ = (int)index;
      sVar6 = std::
              _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::count(local_60,(key_type *)local_48);
      if (sVar6 == 0) {
        EffectAnalyzer::EffectAnalyzer
                  ((EffectAnalyzer *)local_1d0,this->options,this->module,
                   (Expression *)structField._8_8_);
        bVar2 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)local_1d0);
        EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_1d0);
        if (bVar2) goto LAB_00b678e0;
        FindAll<wasm::Call>::FindAll
                  ((FindAll<wasm::Call> *)local_1d0,(Expression *)structField._8_8_);
        uVar1 = local_1d0._8_8_;
        local_58 = (Module *)local_1d0._0_8_;
        std::_Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>::~_Vector_base
                  ((_Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)local_1d0);
        if (local_58 != (Module *)uVar1) goto LAB_00b678e0;
        this_00 = std::__detail::
                  _Map_base<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<const_std::pair<wasm::HeapType,_unsigned_int>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<const_std::pair<wasm::HeapType,_unsigned_int>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](local_50,(key_type *)local_48);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  (this_00,(value_type *)&structField.second);
        addReferences(this,(Expression *)structField._8_8_);
      }
      else {
LAB_00b678e0:
        use(this,(Expression *)structField._8_8_);
      }
    }
  }
  else {
    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
              ((AbstractChildIterator<wasm::ChildIterator> *)local_1d0,curr);
    structField.first.id._0_4_ = 0;
    local_48 = (undefined1  [8])local_1d0;
    IVar8 = AbstractChildIterator<wasm::ChildIterator>::end
                      ((AbstractChildIterator<wasm::ChildIterator> *)local_1d0);
    IVar3 = 0;
    auVar7 = (undefined1  [8])local_1d0;
    while ((IVar3 != IVar8.index || (auVar7 != (undefined1  [8])IVar8.parent))) {
      ppEVar5 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                          ((Iterator *)local_48);
      use(this,*ppEVar5);
      IVar3 = (Index)structField.first.id + 1;
      auVar7 = local_48;
      structField.first.id._0_4_ = IVar3;
    }
    std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
               (local_1d0 + 0x28));
  }
  return;
}

Assistant:

void scanChildren(Expression* curr) {
    // For now, the only special handling we have is fields of struct.new, which
    // we defer walking of to when we know there is a read that can actually
    // read them, see comments above on |expressionQueue|. We can only do that
    // optimization in closed world (as otherwise the field might be read
    // outside of the code we can see), and when it is reached (if it's
    // unreachable then we don't know the type, and can defer that to DCE to
    // remove).
    if (!options.closedWorld || curr->type == Type::unreachable ||
        !curr->is<StructNew>()) {
      for (auto* child : ChildIterator(curr)) {
        use(child);
      }
      return;
    }

    auto* new_ = curr->cast<StructNew>();
    auto type = new_->type.getHeapType();

    for (Index i = 0; i < new_->operands.size(); i++) {
      auto* operand = new_->operands[i];
      auto structField = StructField{type, i};

      // If this struct field has already been read, then we should use the
      // contents there now.
      auto useOperandNow = readStructFields.count(structField);

      // Side effects are tricky to reason about - the side effects must happen
      // even if we never read the struct field - so give up and consider it
      // used.
      if (!useOperandNow) {
        useOperandNow =
          EffectAnalyzer(options, *module, operand).hasSideEffects();
      }

      // We must handle the call.without.effects intrinsic here in a special
      // manner. That intrinsic is reported as having no side effects in
      // EffectAnalyzer, but even though for optimization purposes we can ignore
      // effects, the called code *is* actually reached, and it might have side
      // effects. In other words, the point of the intrinsic is to temporarily
      // ignore those effects during one phase of optimization. Or, put another
      // way, the intrinsic lets us ignore the effects of computing some value,
      // but we do still need to compute that value if it is received and used
      // (if it is not received and used, other passes will remove it).
      if (!useOperandNow) {
        // To detect this, look for any call. A non-intrinsic call would have
        // already been detected when we looked for side effects, so this will
        // only notice intrinsic calls.
        useOperandNow = !FindAll<Call>(operand).list.empty();
      }

      if (useOperandNow) {
        use(operand);
      } else {
        // This data does not need to be read now, but might be read later. Note
        // it as unread.
        unreadStructFieldExprMap[structField].push_back(operand);

        // We also must note that anything in this operand is referenced, even
        // if it never ends up used, so the IR remains valid.
        addReferences(operand);
      }
    }
  }